

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Scale_x86::forward_inplace
          (Scale_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs,
          Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  long lVar9;
  void *pvVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  reference pvVar18;
  reference pvVar19;
  undefined8 *puVar20;
  int iVar21;
  int iVar22;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  __m128 _p128_5;
  int i_6;
  __m128 _p128_4;
  int i_5;
  __m128 _b128_1;
  float b_1;
  __m128 _s128_3;
  float s_1;
  float *ptr_2;
  int q;
  int size_2;
  __m128 _p128_3;
  int j_1;
  __m128 _p128_2;
  int j;
  __m128 _b128;
  float b;
  __m128 _s128_2;
  float s;
  float *ptr_1;
  int i_4;
  int size_1;
  int i_3;
  __m128 _s128_1;
  __m128 _p128_1;
  int i_2;
  int ii_1;
  int remain_size_start_1;
  int nn_size_1;
  int i_1;
  __m128 _bias128;
  __m128 _s128;
  __m128 _p128;
  int i;
  int ii;
  int remain_size_start;
  int nn_size;
  int size;
  float *ptr;
  float *bias;
  float *scale;
  int elempack;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *scale_blob;
  Mat *bottom_top_blob;
  Mat *m;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  int local_63c;
  int local_61c;
  float *local_588;
  int local_580;
  int local_55c;
  int local_53c;
  float *local_500;
  int local_4f4;
  int local_4ec;
  int local_4b8;
  int local_4ac;
  int local_468;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  
  pvVar18 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  pvVar19 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar17 = pvVar18->w;
  iVar3 = pvVar18->h;
  iVar4 = pvVar18->d;
  iVar5 = pvVar18->c;
  iVar6 = pvVar18->dims;
  iVar7 = pvVar18->elempack;
  pvVar8 = pvVar19->data;
  lVar9 = *(long *)(in_RDI + 0x120);
  if (iVar6 == 1) {
    pvVar10 = pvVar18->data;
    iVar21 = iVar17 * iVar7;
    if (*(int *)(in_RDI + 0xd4) == 0) {
      for (local_4b8 = 0; local_4b8 < iVar21 / 4; local_4b8 = local_4b8 + 1) {
        iVar22 = local_4b8 * 4;
        puVar20 = (undefined8 *)((long)pvVar10 + (long)iVar22 * 4);
        uVar11 = *puVar20;
        uVar12 = puVar20[1];
        puVar20 = (undefined8 *)((long)pvVar8 + (long)iVar22 * 4);
        uVar13 = *puVar20;
        uVar14 = puVar20[1];
        puVar20 = (undefined8 *)((long)pvVar10 + (long)iVar22 * 4);
        local_248 = (float)uVar11;
        fStack_244 = (float)((ulong)uVar11 >> 0x20);
        fStack_240 = (float)uVar12;
        fStack_23c = (float)((ulong)uVar12 >> 0x20);
        local_258 = (float)uVar13;
        fStack_254 = (float)((ulong)uVar13 >> 0x20);
        fStack_250 = (float)uVar14;
        fStack_24c = (float)((ulong)uVar14 >> 0x20);
        *puVar20 = CONCAT44(fStack_244 * fStack_254,local_248 * local_258);
        puVar20[1] = CONCAT44(fStack_23c * fStack_24c,fStack_240 * fStack_250);
      }
      for (local_4ec = (iVar21 / 4) * 4; local_4ec < iVar21; local_4ec = local_4ec + 1) {
        *(float *)((long)pvVar10 + (long)local_4ec * 4) =
             *(float *)((long)pvVar10 + (long)local_4ec * 4) *
             *(float *)((long)pvVar8 + (long)local_4ec * 4);
      }
    }
    else {
      for (local_468 = 0; local_468 < iVar21 / 4; local_468 = local_468 + 1) {
        iVar22 = local_468 * 4;
        puVar20 = (undefined8 *)((long)pvVar10 + (long)iVar22 * 4);
        uVar11 = *puVar20;
        uVar12 = puVar20[1];
        puVar20 = (undefined8 *)((long)pvVar8 + (long)iVar22 * 4);
        uVar13 = *puVar20;
        uVar14 = puVar20[1];
        puVar20 = (undefined8 *)(lVar9 + (long)iVar22 * 4);
        uVar15 = *puVar20;
        uVar16 = puVar20[1];
        puVar20 = (undefined8 *)((long)pvVar10 + (long)iVar22 * 4);
        local_2e8 = (float)uVar11;
        fStack_2e4 = (float)((ulong)uVar11 >> 0x20);
        fStack_2e0 = (float)uVar12;
        fStack_2dc = (float)((ulong)uVar12 >> 0x20);
        local_2f8 = (float)uVar13;
        fStack_2f4 = (float)((ulong)uVar13 >> 0x20);
        fStack_2f0 = (float)uVar14;
        fStack_2ec = (float)((ulong)uVar14 >> 0x20);
        local_f8 = (float)uVar15;
        fStack_f4 = (float)((ulong)uVar15 >> 0x20);
        fStack_f0 = (float)uVar16;
        fStack_ec = (float)((ulong)uVar16 >> 0x20);
        *puVar20 = CONCAT44(fStack_2e4 * fStack_2f4 + fStack_f4,local_2e8 * local_2f8 + local_f8);
        puVar20[1] = CONCAT44(fStack_2dc * fStack_2ec + fStack_ec,
                              fStack_2e0 * fStack_2f0 + fStack_f0);
      }
      for (local_4ac = (iVar21 / 4) * 4; local_4ac < iVar21; local_4ac = local_4ac + 1) {
        *(float *)((long)pvVar10 + (long)local_4ac * 4) =
             *(float *)((long)pvVar10 + (long)local_4ac * 4) *
             *(float *)((long)pvVar8 + (long)local_4ac * 4) +
             *(float *)(lVar9 + (long)local_4ac * 4);
      }
    }
  }
  if (iVar6 == 2) {
    iVar21 = iVar17 * iVar7;
    for (local_4f4 = 0; local_4f4 < iVar3; local_4f4 = local_4f4 + 1) {
      local_500 = (float *)((long)pvVar18->data +
                           (long)pvVar18->w * (long)local_4f4 * pvVar18->elemsize);
      fVar1 = *(float *)((long)pvVar8 + (long)local_4f4 * 4);
      if (iVar7 == 4) {
        puVar20 = (undefined8 *)((long)pvVar8 + (long)(local_4f4 << 2) * 4);
        local_678 = *puVar20;
        uStack_670 = puVar20[1];
      }
      else {
        local_678 = CONCAT44(fVar1,fVar1);
        uStack_670 = CONCAT44(fVar1,fVar1);
      }
      local_278 = (float)local_678;
      fStack_274 = (float)((ulong)local_678 >> 0x20);
      fStack_270 = (float)uStack_670;
      fStack_26c = (float)((ulong)uStack_670 >> 0x20);
      if (*(int *)(in_RDI + 0xd4) == 0) {
        for (local_55c = 0; local_55c + 3 < iVar21; local_55c = local_55c + 4) {
          local_268 = (float)*(undefined8 *)local_500;
          fStack_264 = (float)((ulong)*(undefined8 *)local_500 >> 0x20);
          fStack_260 = (float)*(undefined8 *)(local_500 + 2);
          fStack_25c = (float)((ulong)*(undefined8 *)(local_500 + 2) >> 0x20);
          *(ulong *)local_500 = CONCAT44(fStack_264 * fStack_274,local_268 * local_278);
          *(ulong *)(local_500 + 2) = CONCAT44(fStack_25c * fStack_26c,fStack_260 * fStack_270);
          local_500 = local_500 + 4;
        }
        for (; local_55c < iVar21; local_55c = local_55c + 1) {
          *local_500 = *local_500 * fVar1;
          local_500 = local_500 + 1;
        }
      }
      else {
        fVar2 = *(float *)(lVar9 + (long)local_4f4 * 4);
        if (iVar7 == 4) {
          puVar20 = (undefined8 *)(lVar9 + (long)(local_4f4 << 2) * 4);
          local_688 = *puVar20;
          uStack_680 = puVar20[1];
        }
        else {
          local_688 = CONCAT44(fVar2,fVar2);
          uStack_680 = CONCAT44(fVar2,fVar2);
        }
        for (local_53c = 0; local_53c + 3 < iVar21; local_53c = local_53c + 4) {
          local_2c8 = (float)*(undefined8 *)local_500;
          fStack_2c4 = (float)((ulong)*(undefined8 *)local_500 >> 0x20);
          fStack_2c0 = (float)*(undefined8 *)(local_500 + 2);
          fStack_2bc = (float)((ulong)*(undefined8 *)(local_500 + 2) >> 0x20);
          local_d8 = (float)local_688;
          fStack_d4 = (float)((ulong)local_688 >> 0x20);
          fStack_d0 = (float)uStack_680;
          fStack_cc = (float)((ulong)uStack_680 >> 0x20);
          *(ulong *)local_500 =
               CONCAT44(fStack_2c4 * fStack_274 + fStack_d4,local_2c8 * local_278 + local_d8);
          *(ulong *)(local_500 + 2) =
               CONCAT44(fStack_2bc * fStack_26c + fStack_cc,fStack_2c0 * fStack_270 + fStack_d0);
          local_500 = local_500 + 4;
        }
        for (; local_53c < iVar21; local_53c = local_53c + 1) {
          *local_500 = *local_500 * fVar1 + fVar2;
          local_500 = local_500 + 1;
        }
      }
    }
  }
  if ((iVar6 == 3) || (iVar6 == 4)) {
    iVar17 = iVar17 * iVar3 * iVar4 * iVar7;
    for (local_580 = 0; local_580 < iVar5; local_580 = local_580 + 1) {
      local_588 = (float *)((long)pvVar18->data +
                           pvVar18->cstep * (long)local_580 * pvVar18->elemsize);
      fVar1 = *(float *)((long)pvVar8 + (long)local_580 * 4);
      if (iVar7 == 4) {
        puVar20 = (undefined8 *)((long)pvVar8 + (long)(local_580 << 2) * 4);
        local_6c8 = *puVar20;
        uStack_6c0 = puVar20[1];
      }
      else {
        local_6c8 = CONCAT44(fVar1,fVar1);
        uStack_6c0 = CONCAT44(fVar1,fVar1);
      }
      local_298 = (float)local_6c8;
      fStack_294 = (float)((ulong)local_6c8 >> 0x20);
      fStack_290 = (float)uStack_6c0;
      fStack_28c = (float)((ulong)uStack_6c0 >> 0x20);
      if (*(int *)(in_RDI + 0xd4) == 0) {
        for (local_63c = 0; local_63c + 3 < iVar17; local_63c = local_63c + 4) {
          local_288 = (float)*(undefined8 *)local_588;
          fStack_284 = (float)((ulong)*(undefined8 *)local_588 >> 0x20);
          fStack_280 = (float)*(undefined8 *)(local_588 + 2);
          fStack_27c = (float)((ulong)*(undefined8 *)(local_588 + 2) >> 0x20);
          *(ulong *)local_588 = CONCAT44(fStack_284 * fStack_294,local_288 * local_298);
          *(ulong *)(local_588 + 2) = CONCAT44(fStack_27c * fStack_28c,fStack_280 * fStack_290);
          local_588 = local_588 + 4;
        }
        for (; local_63c < iVar17; local_63c = local_63c + 1) {
          *local_588 = *local_588 * fVar1;
          local_588 = local_588 + 1;
        }
      }
      else {
        fVar2 = *(float *)(lVar9 + (long)local_580 * 4);
        if (iVar7 == 4) {
          puVar20 = (undefined8 *)(lVar9 + (long)(local_580 << 2) * 4);
          local_6d8 = *puVar20;
          uStack_6d0 = puVar20[1];
        }
        else {
          local_6d8 = CONCAT44(fVar2,fVar2);
          uStack_6d0 = CONCAT44(fVar2,fVar2);
        }
        for (local_61c = 0; local_61c + 3 < iVar17; local_61c = local_61c + 4) {
          local_2a8 = (float)*(undefined8 *)local_588;
          fStack_2a4 = (float)((ulong)*(undefined8 *)local_588 >> 0x20);
          fStack_2a0 = (float)*(undefined8 *)(local_588 + 2);
          fStack_29c = (float)((ulong)*(undefined8 *)(local_588 + 2) >> 0x20);
          local_b8 = (float)local_6d8;
          fStack_b4 = (float)((ulong)local_6d8 >> 0x20);
          fStack_b0 = (float)uStack_6d0;
          fStack_ac = (float)((ulong)uStack_6d0 >> 0x20);
          *(ulong *)local_588 =
               CONCAT44(fStack_2a4 * fStack_294 + fStack_b4,local_2a8 * local_298 + local_b8);
          *(ulong *)(local_588 + 2) =
               CONCAT44(fStack_29c * fStack_28c + fStack_ac,fStack_2a0 * fStack_290 + fStack_b0);
          local_588 = local_588 + 4;
        }
        for (; local_61c < iVar17; local_61c = local_61c + 1) {
          *local_588 = *local_588 * fVar1 + fVar2;
          local_588 = local_588 + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Scale_x86::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    Mat& bottom_top_blob = bottom_top_blobs[0];
    const Mat& scale_blob = bottom_top_blobs[1];

    const int w = bottom_top_blob.w;
    const int h = bottom_top_blob.h;
    const int d = bottom_top_blob.d;
    const int channels = bottom_top_blob.c;
    const int dims = bottom_top_blob.dims;

    const int elempack = bottom_top_blob.elempack;

    const float* scale = scale_blob;
    const float* bias = bias_data;

    if (dims == 1)
    {
        float* ptr = (float*)bottom_top_blob;
        const int size = w * elempack;

        if (bias_term)
        {
            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _s512 = _mm512_loadu_ps(scale + i);
                __m512 _bias512 = _mm512_loadu_ps(bias + i);
                _mm512_storeu_ps(ptr + i, _mm512_fmadd_ps(_p512, _s512, _bias512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _s256 = _mm256_loadu_ps(scale + i);
                __m256 _bias256 = _mm256_loadu_ps(bias + i);
                _mm256_storeu_ps(ptr + i, _mm256_comp_fmadd_ps(_p256, _s256, _bias256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _s128 = _mm_load_ps(scale + i);
                __m128 _bias128 = _mm_loadu_ps(bias + i);
                _mm_store_ps(ptr + i, _mm_comp_fmadd_ps(_p128, _s128, _bias128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                ptr[i] = ptr[i] * scale[i] + bias[i];
            }
        }
        else
        {
            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _s512 = _mm512_loadu_ps(scale + i);
                _mm512_storeu_ps(ptr + i, _mm512_mul_ps(_p512, _s512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _s256 = _mm256_loadu_ps(scale + i);
                _mm256_storeu_ps(ptr + i, _mm256_mul_ps(_p256, _s256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _s128 = _mm_load_ps(scale + i);
                _mm_store_ps(ptr + i, _mm_mul_ps(_p128, _s128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                ptr[i] = ptr[i] * scale[i];
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            float s = scale[i];
#if __SSE2__
            __m128 _s128 = (elempack == 4) ? _mm_loadu_ps(scale + i * 4) : _mm_set1_ps(s);
#if __AVX__
            __m256 _s256 = (elempack == 8) ? _mm256_loadu_ps(scale + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_s128), _s128, 1);
#if __AVX512F__
            __m512 _s512 = (elempack == 16) ? _mm512_loadu_ps(scale + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_s256), _s256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            if (bias_term)
            {
                float b = bias[i];
#if __SSE2__
                __m128 _b128 = (elempack == 4) ? _mm_loadu_ps(bias + i * 4) : _mm_set1_ps(b);
#if __AVX__
                __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps(bias + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
                __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps(bias + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; j + 15 < size; j += 16)
                {
                    __m512 _p512 = _mm512_loadu_ps(ptr);
                    _mm512_storeu_ps(ptr, _mm512_fmadd_ps(_p512, _s512, _b512));
                    ptr += 16;
                }
#endif // __AVX512F__
                for (; j + 7 < size; j += 8)
                {
                    __m256 _p256 = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_comp_fmadd_ps(_p256, _s256, _b256));
                    ptr += 8;
                }
#endif // __AVX__
                for (; j + 3 < size; j += 4)
                {
                    __m128 _p128 = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_comp_fmadd_ps(_p128, _s128, _b128));
                    ptr += 4;
                }
#endif // __SSE__
                for (; j < size; j++)
                {
                    *ptr = *ptr * s + b;
                    ptr++;
                }
            }
            else
            {
                int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; j + 15 < size; j += 16)
                {
                    __m512 _p512 = _mm512_loadu_ps(ptr);
                    _mm512_storeu_ps(ptr, _mm512_mul_ps(_p512, _s512));
                    ptr += 16;
                }
#endif // __AVX512F__
                for (; j + 7 < size; j += 8)
                {
                    __m256 _p256 = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_mul_ps(_p256, _s256));
                    ptr += 8;
                }
#endif // __AVX__
                for (; j + 3 < size; j += 4)
                {
                    __m128 _p128 = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_mul_ps(_p128, _s128));
                    ptr += 4;
                }
#endif // __SSE__
                for (; j < size; j++)
                {
                    *ptr = *ptr * s;
                    ptr++;
                }
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float s = scale[q];
#if __SSE2__
            __m128 _s128 = (elempack == 4) ? _mm_loadu_ps(scale + q * 4) : _mm_set1_ps(s);
#if __AVX__
            __m256 _s256 = (elempack == 8) ? _mm256_loadu_ps(scale + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_s128), _s128, 1);
#if __AVX512F__
            __m512 _s512 = (elempack == 16) ? _mm512_loadu_ps(scale + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_s256), _s256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            if (bias_term)
            {
                float b = bias[q];
#if __SSE2__
                __m128 _b128 = (elempack == 4) ? _mm_loadu_ps(bias + q * 4) : _mm_set1_ps(b);
#if __AVX__
                __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps(bias + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
                __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps(bias + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p512 = _mm512_loadu_ps(ptr);
                    _mm512_storeu_ps(ptr, _mm512_fmadd_ps(_p512, _s512, _b512));
                    ptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p256 = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_comp_fmadd_ps(_p256, _s256, _b256));
                    ptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p128 = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_comp_fmadd_ps(_p128, _s128, _b128));
                    ptr += 4;
                }
#endif // __SSE__
                for (; i < size; i++)
                {
                    *ptr = *ptr * s + b;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p512 = _mm512_loadu_ps(ptr);
                    _mm512_storeu_ps(ptr, _mm512_mul_ps(_p512, _s512));
                    ptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p256 = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_mul_ps(_p256, _s256));
                    ptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p128 = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_mul_ps(_p128, _s128));
                    ptr += 4;
                }
#endif // __SSE__
                for (; i < size; i++)
                {
                    *ptr = *ptr * s;
                    ptr++;
                }
            }
        }
    }

    return 0;
}